

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keymap.c
# Opt level: O1

void init_keymap(void)

{
  wchar_t wVar1;
  long lVar2;
  nh_cmd_desc *pnVar3;
  long lVar4;
  ulong uVar5;
  
  memset(keymap,0,0xff8);
  keymap[0x103] = find_command("north");
  keymap[0x102] = find_command("south");
  keymap[0x104] = find_command("west");
  keymap[0x105] = find_command("east");
  keymap[0x15c] = find_command("north_west");
  keymap[0x15d] = find_command("north_east");
  keymap[0x15f] = find_command("south_west");
  keymap[0x160] = find_command("south_east");
  keymap[0x106] = find_command("north_west");
  keymap[0x153] = find_command("north_east");
  keymap[0x168] = find_command("south_west");
  keymap[0x152] = find_command("south_east");
  keymap[0xd] = find_command("(nothing)");
  wVar1 = cmdcount;
  lVar2 = (long)cmdcount;
  pnVar3 = commandlist;
  lVar4 = lVar2;
  if (0 < lVar2) {
    do {
      if ((ulong)pnVar3->defkey != 0) {
        keymap[pnVar3->defkey] = pnVar3;
      }
      lVar4 = lVar4 + -1;
      pnVar3 = pnVar3 + 1;
    } while (lVar4 != 0);
  }
  lVar4 = 0;
  do {
    if ((ulong)(byte)builtin_commands[0].desc[lVar4 + 0x50] != 0) {
      keymap[(byte)builtin_commands[0].desc[lVar4 + 0x50]] =
           (nh_cmd_desc *)(builtin_commands[0].name + lVar4);
    }
    lVar4 = lVar4 + 0x6c;
  } while (lVar4 != 0xe58);
  pnVar3 = commandlist;
  if (L'\0' < wVar1) {
    do {
      uVar5 = (ulong)pnVar3->altkey;
      if ((uVar5 != 0) && (keymap[uVar5] == (nh_cmd_desc *)0x0)) {
        keymap[uVar5] = pnVar3;
      }
      lVar2 = lVar2 + -1;
      pnVar3 = pnVar3 + 1;
    } while (lVar2 != 0);
  }
  pnVar3 = commandlist;
  lVar4 = 0;
  do {
    if (((ulong)(byte)builtin_commands[0].desc[lVar4 + 0x51] != 0) &&
       (keymap[(byte)pnVar3->desc[lVar4 + 0x51]] == (nh_cmd_desc *)0x0)) {
      keymap[(byte)builtin_commands[0].desc[lVar4 + 0x51]] =
           (nh_cmd_desc *)(builtin_commands[0].name + lVar4);
    }
    lVar4 = lVar4 + 0x6c;
  } while (lVar4 != 0xe58);
  return;
}

Assistant:

static void init_keymap(void)
{
    int i;
    int count = sizeof(builtin_commands)/sizeof(struct nh_cmd_desc);
    
    memset(keymap, 0, sizeof(keymap));
    
    /* num pad direction keys */
    keymap[KEY_UP] = find_command("north");
    keymap[KEY_DOWN] = find_command("south");
    keymap[KEY_LEFT] = find_command("west");
    keymap[KEY_RIGHT] = find_command("east");
    keymap[KEY_A1] = find_command("north_west");
    keymap[KEY_A3] = find_command("north_east");
    keymap[KEY_C1] = find_command("south_west");
    keymap[KEY_C3] = find_command("south_east");
    /* diagonal keypad keys are not necessarily reported as A1, A3, C1, C3 */
    keymap[KEY_HOME]  = find_command("north_west");
    keymap[KEY_PPAGE] = find_command("north_east");
    keymap[KEY_END]   = find_command("south_west");
    keymap[KEY_NPAGE] = find_command("south_east");
    keymap['\r'] = find_command("(nothing)");
    
    /* every command automatically gets its default key */
    for (i = 0; i < cmdcount; i++)
	if (commandlist[i].defkey)
	    keymap[keytrans(commandlist[i].defkey)] = &commandlist[i];
	
    for (i = 0; i < count; i++)
	if (builtin_commands[i].defkey)
	    keymap[keytrans(builtin_commands[i].defkey)] = &builtin_commands[i];
    
    /* alt keys are assigned if the key is not in use */
    for (i = 0; i < cmdcount; i++) {
	if (commandlist[i].altkey && !keymap[keytrans(commandlist[i].altkey)])
	    keymap[keytrans(commandlist[i].altkey)] = &commandlist[i];
    }
    
    for (i = 0; i < count; i++) {
	if (builtin_commands[i].altkey &&
	    !keymap[keytrans(commandlist[i].altkey)])
	    keymap[keytrans(builtin_commands[i].altkey)] = &builtin_commands[i];
    }
    
}